

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

bool embree::avx512::DiscMiIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  Geometry *pGVar3;
  long lVar4;
  __int_type_conflict _Var5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  ulong uVar21;
  ulong uVar22;
  byte bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  float fVar49;
  undefined4 uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  int local_1d4;
  RayQueryContext *local_1d0;
  Scene *local_1c8;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  uint local_1a8;
  uint local_1a4;
  uint local_1a0;
  RTCFilterFunctionNArguments local_190;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  float local_c0 [4];
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0 [4];
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80 [4];
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar53 [64];
  
  local_1c8 = context->scene;
  pGVar3 = (local_1c8->geometries).items[Disc->sharedGeomID].ptr;
  lVar4 = *(long *)&pGVar3->field_0x58;
  _Var5 = pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar28._16_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[4] * _Var5);
  auVar28._0_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[0] * _Var5);
  auVar31._16_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[5] * _Var5);
  auVar31._0_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[1] * _Var5);
  auVar24._16_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[6] * _Var5);
  auVar24._0_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[2] * _Var5);
  auVar35._16_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[7] * _Var5);
  auVar35._0_16_ = *(undefined1 (*) [16])(lVar4 + (Disc->primIDs).field_0.i[3] * _Var5);
  auVar25 = vunpcklps_avx(auVar28,auVar24);
  auVar28 = vunpckhps_avx(auVar28,auVar24);
  auVar8 = vunpcklps_avx(auVar31,auVar35);
  auVar31 = vunpckhps_avx(auVar31,auVar35);
  auVar27 = vunpcklps_avx(auVar25,auVar8);
  auVar8 = vunpckhps_avx(auVar25,auVar8);
  auVar9 = vunpcklps_avx(auVar28,auVar31);
  local_140 = vpbroadcastd_avx512vl();
  auVar25._0_16_ = *(undefined1 (*) [16])&ray->dir;
  auVar25._16_4_ = ray->tfar;
  auVar25._20_4_ = ray->mask;
  auVar25._24_4_ = ray->id;
  auVar25._28_4_ = ray->flags;
  fVar1 = *(float *)&(ray->dir).field_0;
  auVar29._4_4_ = fVar1;
  auVar29._0_4_ = fVar1;
  auVar29._8_4_ = fVar1;
  auVar29._12_4_ = fVar1;
  auVar29._16_4_ = fVar1;
  auVar29._20_4_ = fVar1;
  auVar29._24_4_ = fVar1;
  auVar29._28_4_ = fVar1;
  auVar24 = vpbroadcastd_avx512vl();
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)((long)&(ray->dir).field_0 + 0xc);
  uVar22 = *(ulong *)((long)&(ray->dir).field_0 + 4);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar22;
  auVar30 = vmovlhps_avx(auVar34,auVar30);
  fVar33 = (float)uVar22;
  auVar32._4_4_ = fVar33;
  auVar32._0_4_ = fVar33;
  auVar32._8_4_ = fVar33;
  auVar32._12_4_ = fVar33;
  auVar32._16_4_ = fVar33;
  auVar32._20_4_ = fVar33;
  auVar32._24_4_ = fVar33;
  auVar32._28_4_ = fVar33;
  auVar7._0_4_ = ray->tfar;
  auVar7._4_4_ = ray->mask;
  auVar7._8_4_ = ray->id;
  auVar7._12_4_ = ray->flags;
  auVar7 = vshufpd_avx(auVar25._0_16_,auVar7,1);
  fVar49 = auVar7._0_4_;
  auVar51._0_4_ = fVar49 * fVar49;
  auVar51._4_4_ = auVar7._4_4_ * auVar7._4_4_;
  auVar51._8_4_ = auVar7._8_4_ * auVar7._8_4_;
  auVar51._12_4_ = auVar7._12_4_ * auVar7._12_4_;
  auVar7 = vfmadd231ps_fma(auVar51,auVar30,auVar30);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar25,auVar25);
  uVar50 = auVar7._0_4_;
  auVar47._4_4_ = uVar50;
  auVar47._0_4_ = uVar50;
  auVar47._8_4_ = uVar50;
  auVar47._12_4_ = uVar50;
  auVar47._16_4_ = uVar50;
  auVar47._20_4_ = uVar50;
  auVar47._24_4_ = uVar50;
  auVar47._28_4_ = uVar50;
  auVar25 = vrcp14ps_avx512vl(auVar47);
  auVar26._8_4_ = 0x3f800000;
  auVar26._0_8_ = 0x3f8000003f800000;
  auVar26._12_4_ = 0x3f800000;
  auVar26._16_4_ = 0x3f800000;
  auVar26._20_4_ = 0x3f800000;
  auVar26._24_4_ = 0x3f800000;
  auVar26._28_4_ = 0x3f800000;
  auVar26 = vfnmadd213ps_avx512vl(auVar47,auVar25,auVar26);
  auVar7 = vfmadd132ps_fma(auVar26,auVar25,auVar25);
  uVar50 = *(undefined4 *)&(ray->org).field_0;
  auVar14._4_4_ = uVar50;
  auVar14._0_4_ = uVar50;
  auVar14._8_4_ = uVar50;
  auVar14._12_4_ = uVar50;
  auVar14._16_4_ = uVar50;
  auVar14._20_4_ = uVar50;
  auVar14._24_4_ = uVar50;
  auVar14._28_4_ = uVar50;
  auVar25 = vsubps_avx512vl(auVar27,auVar14);
  uVar50 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar27._4_4_ = uVar50;
  auVar27._0_4_ = uVar50;
  auVar27._8_4_ = uVar50;
  auVar27._12_4_ = uVar50;
  auVar27._16_4_ = uVar50;
  auVar27._20_4_ = uVar50;
  auVar27._24_4_ = uVar50;
  auVar27._28_4_ = uVar50;
  auVar27 = vsubps_avx512vl(auVar8,auVar27);
  uVar50 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar15._4_4_ = uVar50;
  auVar15._0_4_ = uVar50;
  auVar15._8_4_ = uVar50;
  auVar15._12_4_ = uVar50;
  auVar15._16_4_ = uVar50;
  auVar15._20_4_ = uVar50;
  auVar15._24_4_ = uVar50;
  auVar15._28_4_ = uVar50;
  auVar26 = vsubps_avx512vl(auVar9,auVar15);
  fVar40 = auVar26._0_4_;
  fVar41 = auVar26._4_4_;
  auVar9._4_4_ = fVar41 * fVar49;
  auVar9._0_4_ = fVar40 * fVar49;
  fVar42 = auVar26._8_4_;
  auVar9._8_4_ = fVar42 * fVar49;
  fVar43 = auVar26._12_4_;
  auVar9._12_4_ = fVar43 * fVar49;
  fVar44 = auVar26._16_4_;
  auVar9._16_4_ = fVar44 * fVar49;
  fVar45 = auVar26._20_4_;
  auVar9._20_4_ = fVar45 * fVar49;
  fVar46 = auVar26._24_4_;
  auVar9._24_4_ = fVar46 * fVar49;
  auVar9._28_4_ = auVar8._28_4_;
  auVar30 = vfmadd231ps_fma(auVar9,auVar27,auVar32);
  auVar30 = vfmadd231ps_fma(ZEXT1632(auVar30),auVar25,auVar29);
  fVar36 = auVar7._0_4_ * auVar30._0_4_;
  fVar37 = auVar7._4_4_ * auVar30._4_4_;
  fVar38 = auVar7._8_4_ * auVar30._8_4_;
  fVar39 = auVar7._12_4_ * auVar30._12_4_;
  local_e0 = ZEXT1632(CONCAT412(fVar39,CONCAT48(fVar38,CONCAT44(fVar37,fVar36))));
  fVar2 = ray->tfar;
  auVar52._4_4_ = fVar2;
  auVar52._0_4_ = fVar2;
  auVar52._8_4_ = fVar2;
  auVar52._12_4_ = fVar2;
  auVar52._16_4_ = fVar2;
  auVar52._20_4_ = fVar2;
  auVar52._24_4_ = fVar2;
  auVar52._28_4_ = fVar2;
  auVar53 = ZEXT3264(auVar52);
  uVar10 = vcmpps_avx512vl(local_e0,auVar52,2);
  uVar50 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar8._4_4_ = uVar50;
  auVar8._0_4_ = uVar50;
  auVar8._8_4_ = uVar50;
  auVar8._12_4_ = uVar50;
  auVar8._16_4_ = uVar50;
  auVar8._20_4_ = uVar50;
  auVar8._24_4_ = uVar50;
  auVar8._28_4_ = uVar50;
  uVar11 = vcmpps_avx512vl(local_e0,auVar8,0xd);
  uVar12 = vpcmpgtd_avx512vl(auVar24,_DAT_01fe9900);
  bVar23 = (byte)uVar10 & (byte)uVar11 & (byte)uVar12;
  if (bVar23 != 0) {
    auVar9 = vunpckhps_avx(auVar28,auVar31);
    auVar16._4_4_ = fVar1 * fVar37;
    auVar16._0_4_ = fVar1 * fVar36;
    auVar16._8_4_ = fVar1 * fVar38;
    auVar16._12_4_ = fVar1 * fVar39;
    auVar16._16_4_ = fVar1 * 0.0;
    auVar16._20_4_ = fVar1 * 0.0;
    auVar16._24_4_ = fVar1 * 0.0;
    auVar16._28_4_ = auVar31._28_4_;
    auVar17._4_4_ = fVar33 * fVar37;
    auVar17._0_4_ = fVar33 * fVar36;
    auVar17._8_4_ = fVar33 * fVar38;
    auVar17._12_4_ = fVar33 * fVar39;
    auVar17._16_4_ = fVar33 * 0.0;
    auVar17._20_4_ = fVar33 * 0.0;
    auVar17._24_4_ = fVar33 * 0.0;
    auVar17._28_4_ = auVar24._28_4_;
    auVar48._0_4_ = fVar49 * fVar36;
    auVar48._4_4_ = fVar49 * fVar37;
    auVar48._8_4_ = fVar49 * fVar38;
    auVar48._12_4_ = fVar49 * fVar39;
    auVar48._16_4_ = fVar49 * 0.0;
    auVar48._20_4_ = fVar49 * 0.0;
    auVar48._24_4_ = fVar49 * 0.0;
    auVar48._28_4_ = 0;
    auVar28 = vsubps_avx(auVar25,auVar16);
    auVar31 = vsubps_avx(auVar27,auVar17);
    auVar8 = vsubps_avx(auVar26,auVar48);
    auVar18._4_4_ = auVar8._4_4_ * auVar8._4_4_;
    auVar18._0_4_ = auVar8._0_4_ * auVar8._0_4_;
    auVar18._8_4_ = auVar8._8_4_ * auVar8._8_4_;
    auVar18._12_4_ = auVar8._12_4_ * auVar8._12_4_;
    auVar18._16_4_ = auVar8._16_4_ * auVar8._16_4_;
    auVar18._20_4_ = auVar8._20_4_ * auVar8._20_4_;
    auVar18._24_4_ = auVar8._24_4_ * auVar8._24_4_;
    auVar18._28_4_ = auVar8._28_4_;
    auVar7 = vfmadd231ps_fma(auVar18,auVar31,auVar31);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar28,auVar28);
    auVar19._4_4_ = auVar9._4_4_ * auVar9._4_4_;
    auVar19._0_4_ = auVar9._0_4_ * auVar9._0_4_;
    auVar19._8_4_ = auVar9._8_4_ * auVar9._8_4_;
    auVar19._12_4_ = auVar9._12_4_ * auVar9._12_4_;
    auVar19._16_4_ = auVar9._16_4_ * auVar9._16_4_;
    auVar19._20_4_ = auVar9._20_4_ * auVar9._20_4_;
    auVar19._24_4_ = auVar9._24_4_ * auVar9._24_4_;
    auVar19._28_4_ = auVar9._28_4_;
    uVar10 = vcmpps_avx512vl(ZEXT1632(auVar7),auVar19,2);
    bVar23 = bVar23 & (byte)uVar10;
    if (bVar23 != 0) {
      auVar20._4_4_ = fVar41 * fVar41;
      auVar20._0_4_ = fVar40 * fVar40;
      auVar20._8_4_ = fVar42 * fVar42;
      auVar20._12_4_ = fVar43 * fVar43;
      auVar20._16_4_ = fVar44 * fVar44;
      auVar20._20_4_ = fVar45 * fVar45;
      auVar20._24_4_ = fVar46 * fVar46;
      auVar20._28_4_ = auVar28._28_4_;
      auVar7 = vfmadd213ps_fma(auVar27,auVar27,auVar20);
      auVar7 = vfmadd213ps_fma(auVar25,auVar25,ZEXT1632(auVar7));
      uVar10 = vcmpps_avx512vl(ZEXT1632(auVar7),auVar19,6);
      if ((bVar23 & (byte)uVar10) != 0) {
        local_100 = ZEXT832(0) << 0x20;
        local_120 = ZEXT832(0) << 0x20;
        local_c0[0] = -fVar1;
        local_c0[1] = -fVar1;
        local_c0[2] = -fVar1;
        local_c0[3] = -fVar1;
        fStack_b0 = -fVar1;
        fStack_ac = -fVar1;
        fStack_a8 = -fVar1;
        fStack_a4 = -fVar1;
        local_a0[0] = -fVar33;
        local_a0[1] = -fVar33;
        local_a0[2] = -fVar33;
        local_a0[3] = -fVar33;
        fStack_90 = -fVar33;
        fStack_8c = -fVar33;
        fStack_88 = -fVar33;
        fStack_84 = -fVar33;
        local_80[0] = -fVar49;
        local_80[1] = -fVar49;
        local_80[2] = -fVar49;
        local_80[3] = -fVar49;
        fStack_70 = -fVar49;
        fStack_6c = -fVar49;
        fStack_68 = -fVar49;
        fStack_64 = -fVar49;
        uVar22 = (ulong)(bVar23 & (byte)uVar10);
        local_1d0 = context;
        do {
          local_190.hit = (RTCHitN *)&local_1c0;
          local_190.valid = &local_1d4;
          uVar13 = 0;
          for (uVar21 = uVar22; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
            uVar13 = uVar13 + 1;
          }
          local_1a8 = *(uint *)(local_140 + uVar13 * 4);
          pGVar3 = (local_1c8->geometries).items[local_1a8].ptr;
          if ((pGVar3->mask & ray->mask) != 0) {
            if ((local_1d0->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
              return true;
            }
            local_160 = auVar53._0_32_;
            uVar21 = (ulong)(uint)((int)uVar13 * 4);
            local_1b4 = *(undefined4 *)(local_120 + uVar21);
            local_1b0 = *(undefined4 *)(local_100 + uVar21);
            local_1ac = *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar21);
            local_1c0 = *(undefined4 *)((long)local_c0 + uVar21);
            local_1bc = *(undefined4 *)((long)local_a0 + uVar21);
            local_1b8 = *(undefined4 *)((long)local_80 + uVar21);
            local_1a4 = local_1d0->user->instID[0];
            local_1a0 = local_1d0->user->instPrimID[0];
            ray->tfar = *(float *)(local_e0 + uVar21);
            local_1d4 = -1;
            local_190.geometryUserPtr = pGVar3->userPtr;
            local_190.context = local_1d0->user;
            local_190.N = 1;
            local_190.ray = (RTCRayN *)ray;
            if ((pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
               ((*pGVar3->occlusionFilterN)(&local_190), *local_190.valid != 0)) {
              p_Var6 = local_1d0->args->filter;
              if ((p_Var6 == (RTCFilterFunctionN)0x0) ||
                 ((((local_1d0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                    RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar3->field_8).field_0x2 & 0x40) == 0)) ||
                  ((*p_Var6)(&local_190), *local_190.valid != 0)))) {
                return true;
              }
            }
            auVar53 = ZEXT3264(local_160);
            ray->tfar = local_160._0_4_;
          }
          uVar22 = uVar22 ^ 1L << (uVar13 & 0x3f);
        } while (uVar22 != 0);
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre,
                                         Ray& ray,
                                         RayQueryContext* context,
                                         const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Occluded1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }